

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_jp2h(opj_jp2_t *jp2,opj_cio_t *cio,opj_jp2_color_t *color)

{
  opj_bool oVar1;
  int pos;
  int iVar2;
  opj_cio_t *in_RDX;
  opj_jp2_t *in_RSI;
  opj_jp2_color_t *in_RDI;
  opj_common_ptr cinfo;
  int jp2h_end;
  opj_jp2_box_t box;
  opj_common_ptr cinfo_00;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar3;
  
  cinfo_00 = (opj_common_ptr)in_RDI->icc_profile_buf;
  jp2_read_boxhdr((opj_common_ptr)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  (opj_cio_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  (opj_jp2_box_t *)cinfo_00);
  do {
    if (in_stack_ffffffffffffffd8 != 0x6a703268) {
      if (in_stack_ffffffffffffffd8 == 0x6a703263) {
        opj_event_msg(cinfo_00,1,"Expected JP2H Marker\n");
        return 0;
      }
      cio_skip((opj_cio_t *)in_RSI,in_stack_ffffffffffffffd4 + -8);
      if (*(uchar **)&in_RSI->IPR <= *(uchar **)&in_RSI->approx) {
        return 0;
      }
      jp2_read_boxhdr((opj_common_ptr)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (opj_cio_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (opj_jp2_box_t *)cinfo_00);
    }
    if (in_stack_ffffffffffffffd8 == 0x6a703268) {
      oVar1 = jp2_read_ihdr(in_RSI,in_RDX);
      if (oVar1 == 0) {
        uVar3 = 0;
      }
      else {
        pos = in_stack_ffffffffffffffdc + in_stack_ffffffffffffffd4;
        if ((*(int *)((long)&in_RDI->jp2_pclr + 4) == 0xff) &&
           (oVar1 = jp2_read_bpcc(in_RSI,in_RDX), oVar1 == 0)) {
          uVar3 = 0;
        }
        else {
          jp2_read_boxhdr((opj_common_ptr)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (opj_cio_t *)CONCAT44(in_stack_ffffffffffffffd4,pos),
                          (opj_jp2_box_t *)cinfo_00);
          while (iVar2 = cio_tell((opj_cio_t *)in_RSI), iVar2 < pos) {
            if (in_stack_ffffffffffffffd8 == 0x636f6c72) {
              oVar1 = jp2_read_colr(_jp2h_end,(opj_cio_t *)cinfo,
                                    (opj_jp2_box_t *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    in_RDI);
              if (oVar1 == 0) {
                cio_seek((opj_cio_t *)in_RSI,in_stack_ffffffffffffffdc + 8);
                cio_skip((opj_cio_t *)in_RSI,in_stack_ffffffffffffffd4 + -8);
              }
              jp2_read_boxhdr((opj_common_ptr)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (opj_cio_t *)CONCAT44(in_stack_ffffffffffffffd4,pos),
                              (opj_jp2_box_t *)cinfo_00);
            }
            else if ((in_stack_ffffffffffffffd8 == 0x63646566) &&
                    (*(int *)((long)&in_RDI[2].jp2_cdef + 4) == 0)) {
              oVar1 = jp2_read_cdef(in_RSI,in_RDX,
                                    (opj_jp2_box_t *)CONCAT44(in_stack_ffffffffffffffdc,0x63646566),
                                    (opj_jp2_color_t *)CONCAT44(in_stack_ffffffffffffffd4,pos));
              if (oVar1 == 0) {
                cio_seek((opj_cio_t *)in_RSI,in_stack_ffffffffffffffdc + 8);
                cio_skip((opj_cio_t *)in_RSI,in_stack_ffffffffffffffd4 + -8);
              }
              jp2_read_boxhdr((opj_common_ptr)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (opj_cio_t *)CONCAT44(in_stack_ffffffffffffffd4,pos),
                              (opj_jp2_box_t *)cinfo_00);
            }
            else if ((in_stack_ffffffffffffffd8 == 0x70636c72) &&
                    (*(int *)((long)&in_RDI[2].jp2_cdef + 4) == 0)) {
              oVar1 = jp2_read_pclr(_jp2h_end,(opj_cio_t *)cinfo,
                                    (opj_jp2_box_t *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    in_RDI);
              if (oVar1 == 0) {
                cio_seek((opj_cio_t *)in_RSI,in_stack_ffffffffffffffdc + 8);
                cio_skip((opj_cio_t *)in_RSI,in_stack_ffffffffffffffd4 + -8);
              }
              jp2_read_boxhdr((opj_common_ptr)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (opj_cio_t *)CONCAT44(in_stack_ffffffffffffffd4,pos),
                              (opj_jp2_box_t *)cinfo_00);
            }
            else if ((in_stack_ffffffffffffffd8 == 0x636d6170) &&
                    (*(int *)((long)&in_RDI[2].jp2_cdef + 4) == 0)) {
              oVar1 = jp2_read_cmap(in_RSI,in_RDX,
                                    (opj_jp2_box_t *)CONCAT44(in_stack_ffffffffffffffdc,0x636d6170),
                                    (opj_jp2_color_t *)CONCAT44(in_stack_ffffffffffffffd4,pos));
              if (oVar1 == 0) {
                cio_seek((opj_cio_t *)in_RSI,in_stack_ffffffffffffffdc + 8);
                cio_skip((opj_cio_t *)in_RSI,in_stack_ffffffffffffffd4 + -8);
              }
              jp2_read_boxhdr((opj_common_ptr)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (opj_cio_t *)CONCAT44(in_stack_ffffffffffffffd4,pos),
                              (opj_jp2_box_t *)cinfo_00);
            }
            else {
              cio_seek((opj_cio_t *)in_RSI,in_stack_ffffffffffffffdc + 8);
              cio_skip((opj_cio_t *)in_RSI,in_stack_ffffffffffffffd4 + -8);
              jp2_read_boxhdr((opj_common_ptr)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (opj_cio_t *)CONCAT44(in_stack_ffffffffffffffd4,pos),
                              (opj_jp2_box_t *)cinfo_00);
            }
          }
          cio_seek((opj_cio_t *)in_RSI,pos);
          uVar3 = (uint)(*(char *)&in_RDX->start == '\x01');
        }
      }
      return uVar3;
    }
  } while( true );
}

Assistant:

opj_bool jp2_read_jp2h(opj_jp2_t *jp2, opj_cio_t *cio, opj_jp2_color_t *color) 
{
	opj_jp2_box_t box;
	int jp2h_end;

	opj_common_ptr cinfo = jp2->cinfo;

	jp2_read_boxhdr(cinfo, cio, &box);
	do 
   {
	if (JP2_JP2H != box.type) 
  {
	if (box.type == JP2_JP2C) 
 {
	opj_event_msg(cinfo, EVT_ERROR, "Expected JP2H Marker\n");
	return OPJ_FALSE;
 }
	cio_skip(cio, box.length - 8);

	if(cio->bp >= cio->end) return OPJ_FALSE;

	jp2_read_boxhdr(cinfo, cio, &box);
  }
   } while(JP2_JP2H != box.type);

	if (!jp2_read_ihdr(jp2, cio))
		return OPJ_FALSE;
	jp2h_end = box.init_pos + box.length;

	if (jp2->bpc == 255) 
   {
	if (!jp2_read_bpcc(jp2, cio))
		return OPJ_FALSE;
   }
	jp2_read_boxhdr(cinfo, cio, &box);

	while(cio_tell(cio) < jp2h_end)
   {
	if(box.type == JP2_COLR)
  {
	if( !jp2_read_colr(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_CDEF && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_cdef(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_PCLR && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_pclr(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_CMAP && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_cmap(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
	cio_seek(cio, box.init_pos + 8);
	cio_skip(cio, box.length - 8);
	jp2_read_boxhdr(cinfo, cio, &box);

   }/* while(cio_tell(cio) < box_end) */

	cio_seek(cio, jp2h_end);

/* Part 1, I.5.3.3 : 'must contain at least one' */
	return (color->jp2_has_colr == 1);

}